

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::detail::_SubstrWriter::append(_SubstrWriter *this,csubstr s)

{
  char *pcVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  size_t __n;
  char *__src;
  ulong uVar5;
  
  __n = s.len;
  __src = s.str;
  pcVar1 = (this->buf).str;
  uVar2 = (this->buf).len;
  if (__src + __n <= pcVar1 || pcVar1 + uVar2 <= __src) {
    uVar5 = this->pos + __n;
    if (uVar5 <= uVar2) {
      memcpy((this->buf).str + this->pos,__src,__n);
      uVar5 = __n + this->pos;
    }
    this->pos = uVar5;
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
  }
  handle_error(0x1e71c6,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x492e,"!s.overlaps(buf)");
}

Assistant:

void append(csubstr s)
    {
        C4_ASSERT(!s.overlaps(buf));
        if(pos + s.len <= buf.len)
            memcpy(buf.str + pos, s.str, s.len);
        pos += s.len;
    }